

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

GCproto * check_Lproto(lua_State *L,int nolua)

{
  ulong uVar1;
  
  if (L->base < L->top) {
    uVar1 = L->base->u64;
    if ((long)uVar1 >> 0x2f == -9) {
      if (*(char *)((uVar1 & 0x7fffffffffff) + 10) == '\0') {
        return (GCproto *)(*(long *)((uVar1 & 0x7fffffffffff) + 0x20) + -0x68);
      }
      if (nolua != 0) {
        return (GCproto *)0x0;
      }
    }
    else if ((long)uVar1 >> 0x2f == -8) {
      return (GCproto *)(uVar1 & 0x7fffffffffff);
    }
  }
  lj_err_argt(L,1,6);
}

Assistant:

static GCproto *check_Lproto(lua_State *L, int nolua)
{
  TValue *o = L->base;
  if (L->top > o) {
    if (tvisproto(o)) {
      return protoV(o);
    } else if (tvisfunc(o)) {
      if (isluafunc(funcV(o)))
	return funcproto(funcV(o));
      else if (nolua)
	return NULL;
    }
  }
  lj_err_argt(L, 1, LUA_TFUNCTION);
  return NULL;  /* unreachable */
}